

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::ScalarNode::getValue(ScalarNode *this,SmallVectorImpl<char> *Storage)

{
  char cVar1;
  size_t sVar2;
  size_t N;
  iterator pcVar3;
  iterator pcVar4;
  iterator pcVar5;
  char local_89;
  undefined1 local_88 [8];
  StringRef Valid;
  size_type i_1;
  StringRef UnquotedValue_1;
  StringRef local_50;
  size_type local_40;
  size_type i;
  StringRef UnquotedValue;
  SmallVectorImpl<char> *Storage_local;
  ScalarNode *this_local;
  
  UnquotedValue.Length = (size_t)Storage;
  cVar1 = StringRef::operator[](&this->Value,0);
  if (cVar1 == '\"') {
    sVar2 = StringRef::size(&this->Value);
    _i = StringRef::substr(&this->Value,1,sVar2 - 2);
    StringRef::StringRef(&local_50,"\\\r\n");
    local_40 = StringRef::find_first_of((StringRef *)&i,local_50,0);
    if (local_40 == 0xffffffffffffffff) {
      _this_local = _i;
    }
    else {
      UnquotedValue_1.Length = i;
      _this_local = unescapeDoubleQuoted
                              (this,_i,local_40,(SmallVectorImpl<char> *)UnquotedValue.Length);
    }
  }
  else {
    cVar1 = StringRef::operator[](&this->Value,0);
    if (cVar1 == '\'') {
      sVar2 = StringRef::size(&this->Value);
      _i_1 = StringRef::substr(&this->Value,1,sVar2 - 2);
      Valid.Length = StringRef::find((StringRef *)&i_1,'\'',0);
      if (Valid.Length == 0xffffffffffffffff) {
        _this_local = _i_1;
      }
      else {
        SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)UnquotedValue.Length);
        sVar2 = UnquotedValue.Length;
        N = StringRef::size((StringRef *)&i_1);
        SmallVectorImpl<char>::reserve((SmallVectorImpl<char> *)sVar2,N);
        while (sVar2 = UnquotedValue.Length, Valid.Length != 0xffffffffffffffff) {
          pcVar3 = StringRef::begin((StringRef *)&i_1);
          StringRef::StringRef((StringRef *)local_88,pcVar3,Valid.Length);
          sVar2 = UnquotedValue.Length;
          pcVar4 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)UnquotedValue.Length);
          pcVar3 = StringRef::begin((StringRef *)local_88);
          pcVar5 = StringRef::end((StringRef *)local_88);
          SmallVectorImpl<char>::insert<char_const*,void>
                    ((SmallVectorImpl<char> *)sVar2,pcVar4,pcVar3,pcVar5);
          local_89 = '\'';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)UnquotedValue.Length,&local_89);
          _i_1 = StringRef::substr((StringRef *)&i_1,Valid.Length + 2,0xffffffffffffffff);
          Valid.Length = StringRef::find((StringRef *)&i_1,'\'',0);
        }
        pcVar4 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)UnquotedValue.Length);
        pcVar3 = StringRef::begin((StringRef *)&i_1);
        pcVar5 = StringRef::end((StringRef *)&i_1);
        SmallVectorImpl<char>::insert<char_const*,void>
                  ((SmallVectorImpl<char> *)sVar2,pcVar4,pcVar3,pcVar5);
        pcVar4 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)UnquotedValue.Length);
        sVar2 = SmallVectorBase::size((SmallVectorBase *)UnquotedValue.Length);
        StringRef::StringRef((StringRef *)&this_local,pcVar4,sVar2);
      }
    }
    else {
      _this_local = StringRef::rtrim(&this->Value,' ');
    }
  }
  return _this_local;
}

Assistant:

StringRef ScalarNode::getValue(SmallVectorImpl<char> &Storage) const {
  // TODO: Handle newlines properly. We need to remove leading whitespace.
  if (Value[0] == '"') { // Double quoted.
    // Pull off the leading and trailing "s.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    // Search for characters that would require unescaping the value.
    StringRef::size_type i = UnquotedValue.find_first_of("\\\r\n");
    if (i != StringRef::npos)
      return unescapeDoubleQuoted(UnquotedValue, i, Storage);
    return UnquotedValue;
  } else if (Value[0] == '\'') { // Single quoted.
    // Pull off the leading and trailing 's.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    StringRef::size_type i = UnquotedValue.find('\'');
    if (i != StringRef::npos) {
      // We're going to need Storage.
      Storage.clear();
      Storage.reserve(UnquotedValue.size());
      for (; i != StringRef::npos; i = UnquotedValue.find('\'')) {
        StringRef Valid(UnquotedValue.begin(), i);
        Storage.insert(Storage.end(), Valid.begin(), Valid.end());
        Storage.push_back('\'');
        UnquotedValue = UnquotedValue.substr(i + 2);
      }
      Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
      return StringRef(Storage.begin(), Storage.size());
    }
    return UnquotedValue;
  }
  // Plain or block.
  return Value.rtrim(' ');
}